

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_IndexType.cpp
# Opt level: O1

istream * amrex::operator>>(istream *is,IndexType *it)

{
  uint uVar1;
  istream *piVar2;
  char t2;
  char t1;
  char t0;
  char local_2b;
  char local_2a;
  char local_29;
  
  piVar2 = (istream *)std::istream::ignore((long)is,100000);
  std::operator>>(piVar2,&local_29);
  piVar2 = (istream *)std::istream::ignore((long)is,100000);
  std::operator>>(piVar2,&local_2a);
  piVar2 = (istream *)std::istream::ignore((long)is,100000);
  std::operator>>(piVar2,&local_2b);
  std::istream::ignore((long)is,100000);
  uVar1 = it->itype;
  it->itype = (uint)(local_29 == 'N') | uVar1 & 0xfffffffe;
  uVar1 = ((uint)(local_29 == 'N') | uVar1 & 0xfffffffc) + (uint)(local_2a == 'N') * 2;
  it->itype = uVar1;
  it->itype = (uVar1 & 0xfffffffb) + (uint)(local_2b == 'N') * 4;
  if (((byte)is[*(long *)(*(long *)is + -0x18) + 0x20] & 5) != 0) {
    Error_host("operator>>(ostream&,IndexType&) failed");
  }
  return is;
}

Assistant:

std::istream&
operator>> (std::istream& is,
            IndexType&    it)
{
    char AMREX_D_DECL(t0,t1,t2);

    AMREX_D_EXPR( is.ignore(BL_IGNORE_MAX, '(') >> t0,
            is.ignore(BL_IGNORE_MAX, ',') >> t1,
            is.ignore(BL_IGNORE_MAX, ',') >> t2);
    is.ignore(BL_IGNORE_MAX, ')');
    AMREX_D_TERM(
        BL_ASSERT(t0 == 'C' || t0 == 'N'); t0=='N'?it.set(0):it.unset(0); ,
        BL_ASSERT(t1 == 'C' || t1 == 'N'); t1=='N'?it.set(1):it.unset(1); ,
        BL_ASSERT(t2 == 'C' || t2 == 'N'); t2=='N'?it.set(2):it.unset(2));

    if (is.fail())
        amrex::Error("operator>>(ostream&,IndexType&) failed");

    return is;
}